

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O1

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          unsigned_long batchSize,InnerRegisterSupplier *registerSupplier)

{
  _Type auVar1;
  _Manager_type p_Var2;
  pointer pSVar3;
  pointer pSVar4;
  bool bVar5;
  undefined1 uVar6;
  array<unsigned_char,_1UL> aVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  pointer poVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  size_type __n;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
  writeBuffer;
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
  frontLine;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currentFrontPointers;
  KeyValue<supermap::Key<1UL>,_unsigned_long> minItem;
  _Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true> local_108;
  KeyValue<supermap::Key<1UL>,_unsigned_long> *local_f8;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
  *local_f0;
  size_type local_e8;
  unsigned_long local_e0;
  ulong local_d8;
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
  local_d0;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
  *local_b8;
  path local_b0;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  shared_ptr<supermap::io::FileManager> local_68;
  KeyValue<supermap::Key<1UL>,_unsigned_long> local_58;
  long local_48;
  long local_40;
  long local_38;
  
  local_f0 = this;
  local_e0 = batchSize;
  std::filesystem::__cxx11::path::path(&local_b0,dataFileName,auto_format);
  local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_78 = (_Manager_type)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = registerSupplier->_M_invoker;
  p_Var2 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_88._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_88._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_78 = p_Var2;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  ::SingleFileIndexedStorage
            (&local_f0->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
             ,&local_b0,&local_68,(InnerRegisterSupplier *)&local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_b0);
  (local_f0->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  ).
  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00205b30;
  (local_f0->
  super_Findable<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>).
  _vptr_Findable = (_func_int **)&DAT_00205b78;
  pSVar3 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)pSVar4 - (long)pSVar3 >> 3) * 0x6db6db6db6db6db7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0,__n,
             (allocator_type *)&local_d0);
  local_f8 = (KeyValue<supermap::Key<1UL>,_unsigned_long> *)((ulong)local_f8 & 0xffffffffffffff00);
  local_e8 = __n;
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
  ::vector(&local_d0,__n,(value_type *)&local_108._M_value,(allocator_type *)&local_58);
  if (pSVar4 == pSVar3) {
    lVar15 = 0;
  }
  else {
    lVar12 = local_e8 + (local_e8 == 0);
    lVar16 = 0x10;
    lVar13 = 0;
    lVar15 = 0;
    do {
      pSVar3 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = (**(code **)(*(long *)((long)&(pSVar3->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                            ._vptr_OrderedStorage + lVar13) + 8))
                        ((long)&(pSVar3->
                                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                ).
                                super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                .
                                super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                ._vptr_OrderedStorage + lVar13);
      poVar11 = local_d0.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (lVar8 != 0) {
        pSVar3 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (**(code **)(*(long *)((long)&(pSVar3->
                                              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                              ).
                                              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                              .
                                              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                              ._vptr_OrderedStorage + lVar13) + 0x20))
                          ((long)&(pSVar3->
                                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                  ).
                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                  .
                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                  ._vptr_OrderedStorage + lVar13,0);
        if (*(char *)((long)&(poVar11->
                             super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                             ._M_payload + lVar16) == '\x01') {
          *(undefined1 *)
           ((long)&(poVar11->
                   super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                   )._M_payload.
                   super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                   ._M_payload + lVar16) = 0;
        }
        *(undefined1 *)((long)poVar11 + lVar16 + -0x10) = uVar6;
        *(undefined8 *)((long)poVar11 + lVar16 + -8) = extraout_RDX;
        *(undefined1 *)
         ((long)&(poVar11->
                 super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                 ._M_payload + lVar16) = 1;
        pSVar3 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar8 = (**(code **)(*(long *)((long)&(pSVar3->
                                              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                              ).
                                              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                              .
                                              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                              ._vptr_OrderedStorage + lVar13) + 8))
                          ((long)&(pSVar3->
                                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                  ).
                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                  .
                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                  ._vptr_OrderedStorage + lVar13);
        lVar15 = lVar15 + lVar8;
      }
      lVar13 = lVar13 + 0x38;
      lVar16 = lVar16 + 0x18;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  (*(local_f0->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
    ).
    super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>
    ._vptr_Cloneable[5])
            (&(local_f0->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
              .register_,lVar15);
  local_108._0_8_ = (KeyValue<supermap::Key<1UL>,_unsigned_long> *)0x0;
  local_108._M_value.value = 0;
  local_f8 = (KeyValue<supermap::Key<1UL>,_unsigned_long> *)0x0;
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
             *)&local_108._M_value,local_e0);
  local_e8 = (size_type)((int)local_e8 - 1);
  local_38 = local_e8 + 1;
  local_40 = local_e8 * 3 + 2;
  local_48 = local_e8 * 0x38;
  local_b8 = newer;
  do {
    if ((int)local_e8 < 0) {
      lVar15 = 0;
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      lVar12 = 0;
      lVar13 = local_38;
      lVar16 = local_48;
      lVar8 = local_40;
      do {
        lVar15 = lVar12;
        if (*(char *)((long)&((local_d0.
                               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                             ._M_payload + lVar8 * 8) == '\x01') {
          lVar15 = lVar13 + -1;
          if ((uVar9 & 1) == 0) {
            uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
          }
          else {
            if (local_d0.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar12].
                super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                ._M_engaged == false) {
              std::__throw_bad_optional_access();
            }
            aVar7._M_elems[0] =
                 (_Type)local_d0.
                        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar12].
                        super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                        ._M_payload._M_value.key.super_array<unsigned_char,_1UL>._M_elems[0];
            auVar1[0] = *(uchar *)((long)local_d0.
                                         super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  lVar8 * 8 + -0x10);
            if (((byte)aVar7._M_elems[0] <= auVar1[0]) &&
               (lVar15 = lVar12, (_Type)auVar1[0] == aVar7._M_elems[0])) {
              lVar15 = *(long *)(local_b0._M_pathname._M_dataplus._M_p + lVar13 * 8 + -8);
              *(ulong *)(local_b0._M_pathname._M_dataplus._M_p + lVar13 * 8 + -8) = lVar15 + 1U;
              pSVar3 = (newer->
                       super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_d8 = uVar9;
              uVar9 = (**(code **)(*(long *)((long)&(pSVar3->
                                                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                                  ).
                                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                                  .
                                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                                  ._vptr_OrderedStorage + lVar16) + 8))
                                ((long)&(pSVar3->
                                        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                        ).
                                        super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                        .
                                        super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                        ._vptr_OrderedStorage + lVar16);
              newer = local_b8;
              poVar11 = local_d0.
                        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (lVar15 + 1U < uVar9) {
                pSVar3 = (local_b8->
                         super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                uVar6 = (**(code **)(*(long *)((long)&(pSVar3->
                                                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                                  ).
                                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                                  .
                                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                                  ._vptr_OrderedStorage + lVar16) + 0x20))
                                  ((long)&(pSVar3->
                                          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                          ).
                                          super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                          .
                                          super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                          ._vptr_OrderedStorage + lVar16,
                                   *(undefined8 *)
                                    (local_b0._M_pathname._M_dataplus._M_p + lVar13 * 8 + -8));
                if (*(char *)((long)&(poVar11->
                                     super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                                     )._M_payload.
                                     super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                                     ._M_payload + lVar8 * 8) == '\x01') {
                  *(undefined1 *)
                   ((long)&(poVar11->
                           super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                           ._M_payload + lVar8 * 8) = 0;
                }
                *(undefined1 *)((long)poVar11 + lVar8 * 8 + -0x10) = uVar6;
                *(undefined8 *)((long)poVar11 + lVar8 * 8 + -8) = extraout_RDX_00;
                *(undefined1 *)
                 ((long)&(poVar11->
                         super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                         )._M_payload.
                         super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                         ._M_payload + lVar8 * 8) = 1;
                lVar15 = lVar12;
                uVar9 = local_d8;
              }
              else {
                lVar15 = lVar12;
                uVar9 = local_d8;
                if (*(char *)((long)&((local_d0.
                                       super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                                     )._M_payload.
                                     super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                                     ._M_payload + lVar8 * 8) == '\x01') {
                  *(undefined1 *)
                   ((long)&((local_d0.
                             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                           ._M_payload + lVar8 * 8) = 0;
                }
              }
            }
          }
        }
        lVar8 = lVar8 + -3;
        lVar16 = lVar16 + -0x38;
        lVar14 = lVar13 + -1;
        bVar5 = 0 < lVar13;
        lVar12 = lVar15;
        lVar13 = lVar14;
      } while (lVar14 != 0 && bVar5);
    }
    if ((uVar9 & 1) == 0) break;
    if (local_d0.
        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar15].
        super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
        _M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    poVar11 = local_d0.
              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar15;
    local_58._0_4_ =
         *(undefined4 *)
          &(poVar11->
           super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>).
           _M_payload.
           super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
           _M_payload;
    local_58._4_4_ =
         *(undefined4 *)
          ((long)&(poVar11->
                  super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                  )._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                  ._M_payload + 4);
    local_58.value._0_4_ =
         *(undefined4 *)
          ((long)&(poVar11->
                  super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                  )._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                  ._M_payload + 8);
    local_58.value._4_4_ =
         *(undefined4 *)
          ((long)&(poVar11->
                  super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
                  )._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>
                  ._M_payload + 0xc);
    lVar12 = (long)(int)lVar15;
    lVar15 = *(long *)(local_b0._M_pathname._M_dataplus._M_p + lVar12 * 8);
    *(ulong *)(local_b0._M_pathname._M_dataplus._M_p + lVar12 * 8) = lVar15 + 1U;
    pSVar3 = (newer->
             super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (**(code **)(*(long *)&pSVar3[lVar12].
                                    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                    .
                                    super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                    .
                                    super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                         + 8))(pSVar3 + lVar12);
    poVar11 = local_d0.
              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (lVar15 + 1U < uVar10) {
      pSVar3 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      aVar7._M_elems[0] =
           (_Type)(**(code **)(*(long *)&pSVar3[lVar12].
                                         super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                         .
                                         super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                                         .
                                         super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                              + 0x20))
                            (pSVar3 + lVar12,
                             *(undefined8 *)(local_b0._M_pathname._M_dataplus._M_p + lVar12 * 8));
      poVar11 = poVar11 + lVar12;
      if ((poVar11->
          super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
          _M_engaged == true) {
        (poVar11->
        super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
        _M_engaged = false;
      }
      (poVar11->
      super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
      _M_payload._M_value.key.super_array<unsigned_char,_1UL>._M_elems[0] = (uchar)aVar7._M_elems[0]
      ;
      (poVar11->
      super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
      _M_payload._M_value.value = extraout_RDX_01;
      (poVar11->
      super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
      _M_engaged = true;
    }
    else if (local_d0.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar12].
             super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
             _M_engaged == true) {
      local_d0.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar12].
      super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
      _M_engaged = false;
    }
    if ((KeyValue<supermap::Key<1UL>,_unsigned_long> *)local_108._M_value.value == local_f8) {
      std::
      vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>
      ::_M_realloc_insert<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>
                ((vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>
                  *)&local_108._M_value,(iterator)local_108._M_value.value,&local_58);
    }
    else {
      *(undefined4 *)local_108._M_value.value = local_58._0_4_;
      *(undefined4 *)(local_108._M_value.value + 4) = local_58._4_4_;
      *(undefined4 *)(local_108._M_value.value + 8) = (undefined4)local_58.value;
      *(undefined4 *)(local_108._M_value.value + 0xc) = local_58.value._4_4_;
      local_108._M_value.value = local_108._M_value.value + 0x10;
    }
    if (local_e0 <= (ulong)((long)(local_108._M_value.value - local_108._0_8_) >> 4)) {
      SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>
      ::
      appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,void>
                ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>
                  *)local_f0);
      if (local_108._M_value.value != local_108._0_8_) {
        local_108._M_value.value = local_108._0_8_;
      }
      std::
      vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
      ::reserve((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
                 *)&local_108._M_value,local_e0);
    }
  } while ((uVar9 & 1) != 0);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>
  ::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>
              *)local_f0,local_108._0_8_,local_108._M_value.value);
  if (local_108._M_value.value != local_108._0_8_) {
    local_108._M_value.value = local_108._0_8_;
  }
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>
             *)&local_108._M_value,local_e0);
  if ((KeyValue<supermap::Key<1UL>,_unsigned_long> *)local_108._0_8_ !=
      (KeyValue<supermap::Key<1UL>,_unsigned_long> *)0x0) {
    operator_delete((void *)local_108._0_8_,(long)local_f8 - local_108._0_8_);
  }
  if (local_d0.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                    local_b0._M_pathname.field_2._M_allocated_capacity -
                    (long)local_b0._M_pathname._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }